

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

Result init_emulator(Emulator *e,EmulatorInit *init)

{
  FileData *file_data;
  byte bVar1;
  EmulatorState *pEVar2;
  Apu *pAVar3;
  EmulatorInit *pEVar4;
  Result RVar5;
  uint uVar6;
  void *pvVar7;
  u8 checksum;
  byte bVar8;
  u32 uVar9;
  long lVar10;
  CgbFlag CVar11;
  Bool BVar12;
  ulong uVar13;
  size_t offset;
  char *pcVar14;
  CartInfo *pCVar15;
  u8 *__s;
  int iVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  bool bVar20;
  size_t local_68 [2];
  undefined1 local_58;
  CartInfo *local_50;
  size_t local_48;
  EmulatorInit *local_40;
  u32 random_seed;
  
  file_data = &e->file_data;
  local_68[0] = (e->file_data).size;
  pCVar15 = e->cart_infos;
  lVar17 = 0;
  offset = 0;
  local_50 = pCVar15;
  local_48 = local_68[0];
  local_40 = init;
  while ((lVar17 != 0x100 && (offset + 0x8000 <= (e->file_data).size))) {
    RVar5 = get_cart_info(file_data,offset,pCVar15,TRUE,local_68);
    if (RVar5 == OK) {
      if (s_cart_type_info[pCVar15->cart_type].mbc_type == MBC_TYPE_MMM01) goto LAB_00182565;
      e->cart_info_count = e->cart_info_count + 1;
    }
    lVar17 = lVar17 + 1;
    pCVar15 = pCVar15 + 1;
    offset = offset + 0x8000;
  }
  if (e->cart_info_count == 0) {
    RVar5 = get_cart_info(file_data,0,local_50,FALSE,local_68);
    uVar9 = e->cart_info_count;
    if (RVar5 == OK) {
      uVar9 = uVar9 + 1;
      e->cart_info_count = uVar9;
    }
    if (uVar9 == 0) {
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
              0x4a8);
      fwrite("Invalid ROM.\n",0xd,1,_stderr);
      return ERROR;
    }
  }
  lVar17 = 0;
LAB_00182565:
  if (local_48 < local_68[0]) {
    file_data_resize(file_data,local_68[0]);
    uVar6 = e->cart_info_count;
    for (lVar10 = 0; (ulong)uVar6 * 0x30 - lVar10 != 0; lVar10 = lVar10 + 0x30) {
      *(u8 **)((long)&e->cart_infos[0].data + lVar10) =
           (e->file_data).data + *(long *)((long)&e->cart_infos[0].offset + lVar10);
    }
  }
  set_cart_info(e,(u8)lVar17);
  pCVar15 = e->cart_info;
  local_68[0] = 0;
  local_68[1] = 0;
  local_58 = 0;
  __s = pCVar15->data + 0x134;
  uVar13 = 0;
  pvVar7 = memchr(__s,0,0x10);
  uVar6 = 0x10;
  if (pvVar7 != (void *)0x0) {
    uVar6 = (int)pvVar7 - (int)__s;
  }
  memcpy(local_68,__s,(long)(int)uVar6);
  uVar18 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar18 = uVar13;
  }
  for (; uVar18 != uVar13; uVar13 = uVar13 + 1) {
    if (*(char *)((long)local_68 + uVar13) < ' ') {
      *(undefined1 *)((long)local_68 + uVar13) = 0x20;
    }
  }
  printf("title: \"%s\"\n",local_68);
  pcVar14 = "unknown";
  if ((ulong)pCVar15->cgb_flag < 0xc1) {
    pcVar14 = *(char **)(get_cgb_flag_string_s_strings + (ulong)pCVar15->cgb_flag * 8);
  }
  if (pcVar14 == (char *)0x0) {
    pcVar14 = "unknown";
  }
  printf("cgb flag: %s\n",pcVar14);
  pcVar14 = "unknown";
  if ((ulong)pCVar15->sgb_flag < 4) {
    pcVar14 = *(char **)(get_sgb_flag_string_s_strings + (ulong)pCVar15->sgb_flag * 8);
  }
  if (pcVar14 == (char *)0x0) {
    pcVar14 = "unknown";
  }
  printf("sgb flag: %s\n",pcVar14);
  pcVar14 = "unknown";
  if ((ulong)pCVar15->cart_type < 0x100) {
    pcVar14 = *(char **)(get_cart_type_string_s_strings + (ulong)pCVar15->cart_type * 8);
  }
  if (pcVar14 == (char *)0x0) {
    pcVar14 = "unknown";
  }
  printf("cart type: %s\n",pcVar14);
  pcVar14 = "unknown";
  if ((ulong)pCVar15->rom_size < 9) {
    pcVar14 = *(char **)(get_rom_size_string_s_strings + (ulong)pCVar15->rom_size * 8);
  }
  if (pcVar14 == (char *)0x0) {
    pcVar14 = "unknown";
  }
  printf("rom size: %s\n",pcVar14);
  pcVar14 = "unknown";
  if ((ulong)pCVar15->ext_ram_size < 6) {
    pcVar14 = *(char **)(get_ext_ram_size_string_s_strings + (ulong)pCVar15->ext_ram_size * 8);
  }
  pcVar19 = "unknown";
  if (pcVar14 != (char *)0x0) {
    pcVar19 = pcVar14;
  }
  printf("ext ram size: %s\n",pcVar19);
  pEVar4 = local_40;
  bVar1 = pCVar15->data[0x14d];
  bVar8 = 0;
  for (lVar17 = 0; lVar17 != 0x19; lVar17 = lVar17 + 1) {
    bVar8 = bVar8 + ~pCVar15->data[lVar17 + 0x134];
  }
  pcVar14 = "unknown";
  if (*(char **)(get_result_string_s_strings + (ulong)(bVar8 != bVar1) * 8) != (char *)0x0) {
    pcVar14 = *(char **)(get_result_string_s_strings + (ulong)(bVar8 != bVar1) * 8);
  }
  BVar12 = FALSE;
  printf("header checksum: 0x%02x [%s]\n",(ulong)bVar1,pcVar14);
  (e->state).memory_map_state.rom_base[0] = 0;
  (e->state).memory_map_state.rom_base[1] = 0x4000;
  if (pEVar4->force_dmg == FALSE) {
    CVar11 = e->cart_info->cgb_flag & 0xffffffbf;
    bVar20 = CVar11 == CGB_FLAG_SUPPORTED;
    (e->state).is_cgb = (uint)bVar20;
    if (CVar11 != CGB_FLAG_SUPPORTED) {
      BVar12 = (Bool)(e->cart_info->sgb_flag == SGB_FLAG_SUPPORTED);
    }
  }
  else {
    (e->state).is_cgb = FALSE;
    bVar20 = false;
    BVar12 = FALSE;
  }
  (e->state).is_sgb = BVar12;
  (e->state).reg.F.Z = TRUE;
  (e->state).reg.F.N = FALSE;
  (e->state).reg.F.H = TRUE;
  (e->state).reg.F.C = TRUE;
  (e->state).reg.A = bVar20 * '\x10' + '\x01';
  (e->state).reg.field_1 = (anon_union_2_2_e984aa4b_for_Registers_1)0x13;
  (e->state).reg.field_2 = (anon_union_2_2_e984b20b_for_Registers_3)0xd8;
  (e->state).reg.field_3 = (anon_union_2_2_e984c1e8_for_Registers_5)0x14d;
  (e->state).reg.SP = 0xfffe;
  (e->state).reg.PC = 0x100;
  (e->state).interrupt.ime = FALSE;
  (e->state).timer.div_counter = 0xac00;
  (e->state).next_intr_ticks = 0xffffffffffffffff;
  (e->state).serial.next_intr_ticks = 0xffffffffffffffff;
  (e->state).timer.next_intr_ticks = 0xffffffffffffffff;
  (e->state).wram.offset = 0x1000;
  write_apu(e,0x16,0xf1);
  write_apu(e,1,0x80);
  write_apu(e,2,0xf3);
  write_apu(e,4,0x80);
  write_apu(e,0x14,'w');
  write_apu(e,0x15,0xf3);
  (e->state).apu.initialized = TRUE;
  pEVar2 = &e->state;
  (pEVar2->apu).wave.ram[0] = '`';
  (pEVar2->apu).wave.ram[1] = '\r';
  (pEVar2->apu).wave.ram[2] = 0xda;
  (pEVar2->apu).wave.ram[3] = 0xdd;
  (pEVar2->apu).wave.ram[4] = 'P';
  (pEVar2->apu).wave.ram[5] = '\x0f';
  (pEVar2->apu).wave.ram[6] = 0xad;
  (pEVar2->apu).wave.ram[7] = 0xed;
  pAVar3 = &(e->state).apu;
  (pAVar3->wave).ram[8] = 0xc0;
  (pAVar3->wave).ram[9] = 0xde;
  (pAVar3->wave).ram[10] = 0xf0;
  (pAVar3->wave).ram[0xb] = '\r';
  (pAVar3->wave).ram[0xc] = 0xbe;
  (pAVar3->wave).ram[0xd] = 0xef;
  (pAVar3->wave).ram[0xe] = 0xfe;
  (pAVar3->wave).ram[0xf] = 0xed;
  (e->state).apu.channel[0].envelope.volume = '\0';
  write_io(e,0x40,0x91);
  write_io(e,0x42,'\0');
  write_io(e,0x43,'\0');
  write_io(e,0x45,'\0');
  write_io(e,0x47,0xfc);
  write_io(e,0x48,0xff);
  write_io(e,0x49,0xff);
  write_io(e,0xf,'\x01');
  write_io(e,0xff,'\0');
  (e->state).hdma.blocks = 0xff;
  emulator_set_builtin_palette(e,pEVar4->builtin_palette);
  e->cgb_color_curve = pEVar4->cgb_color_curve;
  for (iVar16 = 0; iVar16 != 2; iVar16 = iVar16 + 1) {
    lVar17 = 0x3398c;
    if (iVar16 == 0) {
      lVar17 = 0x338c4;
    }
    for (uVar13 = 0; uVar13 != 0x20; uVar13 = uVar13 + 1) {
      *(undefined4 *)
       ((long)(e->config).disable_sound +
       (ulong)((uint)uVar13 & 3) * 4 + (uVar13 >> 2 & 0x3fffffff) * 0x10 + lVar17) = 0xffffffff;
      *(undefined2 *)((long)&e->cart_infos[1].cgb_flag + uVar13 * 2 + lVar17) = 0x7fff;
    }
  }
  random_seed = pEVar4->random_seed;
  (e->state).random_seed = random_seed;
  randomize_buffer(&random_seed,(e->state).ext_ram.data,0x20000);
  randomize_buffer(&random_seed,(e->state).wram.data,0x8000);
  randomize_buffer(&random_seed,(e->state).hram,0x7f);
  (e->state).cpu_tick = 4;
  calculate_next_ppu_intr(e);
  return OK;
}

Assistant:

Result init_emulator(Emulator* e, const EmulatorInit* init) {
  static u8 s_initial_wave_ram[WAVE_RAM_SIZE] = {
      0x60, 0x0d, 0xda, 0xdd, 0x50, 0x0f, 0xad, 0xed,
      0xc0, 0xde, 0xf0, 0x0d, 0xbe, 0xef, 0xfe, 0xed,
  };
  CHECK(SUCCESS(get_cart_infos(e)));
  log_cart_info(e->cart_info);
  MMAP_STATE.rom_base[0] = 0;
  MMAP_STATE.rom_base[1] = 1 << ROM_BANK_SHIFT;
  IS_CGB = !init->force_dmg && (e->cart_info->cgb_flag == CGB_FLAG_SUPPORTED ||
                                e->cart_info->cgb_flag == CGB_FLAG_REQUIRED);
  IS_SGB = !init->force_dmg && !IS_CGB &&
           e->cart_info->sgb_flag == SGB_FLAG_SUPPORTED;
  set_af_reg(e, 0xb0);
  REG.A = IS_CGB ? 0x11 : 0x01;
  REG.BC = 0x0013;
  REG.DE = 0x00d8;
  REG.HL = 0x014d;
  REG.SP = 0xfffe;
  REG.PC = 0x0100;
  INTR.ime = FALSE;
  TIMER.div_counter = 0xAC00;
  TIMER.next_intr_ticks = SERIAL.next_intr_ticks = e->state.next_intr_ticks =
      INVALID_TICKS;
  WRAM.offset = 0x1000;
  /* Enable apu first, so subsequent writes succeed. */
  write_apu(e, APU_NR52_ADDR, 0xf1);
  write_apu(e, APU_NR11_ADDR, 0x80);
  write_apu(e, APU_NR12_ADDR, 0xf3);
  write_apu(e, APU_NR14_ADDR, 0x80);
  write_apu(e, APU_NR50_ADDR, 0x77);
  write_apu(e, APU_NR51_ADDR, 0xf3);
  APU.initialized = TRUE;
  memcpy(&WAVE.ram, s_initial_wave_ram, WAVE_RAM_SIZE);
  /* Turn down the volume on channel1, it is playing by default (because of the
   * GB startup sound), but we don't want to hear it when starting the
   * emulator. */
  CHANNEL1.envelope.volume = 0;
  write_io(e, IO_LCDC_ADDR, 0x91);
  write_io(e, IO_SCY_ADDR, 0x00);
  write_io(e, IO_SCX_ADDR, 0x00);
  write_io(e, IO_LYC_ADDR, 0x00);
  write_io(e, IO_BGP_ADDR, 0xfc);
  write_io(e, IO_OBP0_ADDR, 0xff);
  write_io(e, IO_OBP1_ADDR, 0xff);
  write_io(e, IO_IF_ADDR, 0x1);
  write_io(e, IO_IE_ADDR, 0x0);
  HDMA.blocks = 0xff;

  /* Set initial DMG/SGB palettes */
  emulator_set_builtin_palette(e, init->builtin_palette);

  /* Set up cgb color curve */
  e->cgb_color_curve = init->cgb_color_curve;

  /* Set initial CGB palettes to white. */
  int pal_index;
  for (pal_index = 0; pal_index < 2; ++pal_index) {
    ColorPalettes* palette = pal_index == 0 ? &PPU.bgcp : &PPU.obcp;
    int i;
    for (i = 0; i < 32; ++i) {
      palette->palettes[i >> 2].color[i & 3] = RGBA_WHITE;
      palette->data[i * 2] = 0xff;
      palette->data[i * 2 + 1] = 0x7f;
    }
  }

  /* Randomize RAM */
  u32 random_seed = init->random_seed;
  e->state.random_seed = random_seed;
  randomize_buffer(&random_seed, e->state.ext_ram.data, EXT_RAM_MAX_SIZE);
  randomize_buffer(&random_seed, e->state.wram.data, WORK_RAM_SIZE);
  randomize_buffer(&random_seed, e->state.hram, HIGH_RAM_SIZE);

  e->state.cpu_tick = CPU_TICK;
  calculate_next_ppu_intr(e);
  return OK;
  ON_ERROR_RETURN;
}